

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O3

cmList * __thiscall cmList::filter(cmList *this,string_view pattern,FilterMode mode)

{
  pointer pbVar1;
  cmList *pcVar2;
  bool bVar3;
  invalid_argument *this_00;
  long lVar4;
  long lVar5;
  pointer this_01;
  iterator __first;
  pointer pbVar6;
  RegularExpression regex;
  string local_298;
  cmList *local_278;
  basic_string_view<char,_std::char_traits<char>_> local_270;
  RegularExpression local_260;
  
  local_270._M_str = pattern._M_str;
  local_270._M_len = pattern._M_len;
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_298,local_270._M_str,local_270._M_str + local_270._M_len);
  local_260.regmust = (char *)0x0;
  local_260.program = (char *)0x0;
  local_260.progsize = 0;
  memset(&local_260,0,0x20a);
  cmsys::RegularExpression::compile(&local_260,local_298._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if (local_260.program == (char *)0x0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    cmStrCat<char_const(&)[57],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[3]>
              (&local_298,(char (*) [57])"sub-command FILTER, mode REGEX failed to compile regex \""
               ,&local_270,(char (*) [3])0x822290);
    std::invalid_argument::invalid_argument(this_00,(string *)&local_298);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  this_01 = (this->Values).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->Values).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)pbVar1 - (long)this_01;
  local_278 = this;
  if (0 < lVar5 >> 7) {
    lVar4 = (lVar5 >> 7) + 1;
    pbVar6 = this_01 + 2;
    do {
      this_01 = pbVar6;
      bVar3 = cmsys::RegularExpression::find
                        (&local_260,this_01[-2]._M_dataplus._M_p,&local_260.regmatch);
      if ((mode == INCLUDE) != bVar3) {
        this_01 = this_01 + -2;
        goto LAB_001b2595;
      }
      bVar3 = cmsys::RegularExpression::find
                        (&local_260,this_01[-1]._M_dataplus._M_p,&local_260.regmatch);
      if ((mode == INCLUDE) != bVar3) {
        this_01 = this_01 + -1;
        goto LAB_001b2595;
      }
      bVar3 = cmsys::RegularExpression::find
                        (&local_260,(this_01->_M_dataplus)._M_p,&local_260.regmatch);
      if ((mode == INCLUDE) != bVar3) goto LAB_001b2595;
      bVar3 = cmsys::RegularExpression::find
                        (&local_260,this_01[1]._M_dataplus._M_p,&local_260.regmatch);
      if ((mode == INCLUDE) != bVar3) {
        this_01 = this_01 + 1;
        goto LAB_001b2595;
      }
      lVar4 = lVar4 + -1;
      lVar5 = lVar5 + -0x80;
      pbVar6 = this_01 + 4;
    } while (1 < lVar4);
    this_01 = this_01 + 2;
  }
  lVar5 = lVar5 >> 5;
  if (lVar5 == 1) {
LAB_001b2563:
    bVar3 = cmsys::RegularExpression::find
                      (&local_260,(this_01->_M_dataplus)._M_p,&local_260.regmatch);
    if ((mode == INCLUDE) == bVar3) {
      this_01 = pbVar1;
    }
  }
  else if (lVar5 == 2) {
LAB_001b2546:
    bVar3 = cmsys::RegularExpression::find
                      (&local_260,(this_01->_M_dataplus)._M_p,&local_260.regmatch);
    if ((mode == INCLUDE) == bVar3) {
      this_01 = this_01 + 1;
      goto LAB_001b2563;
    }
  }
  else {
    __first._M_current = pbVar1;
    if (lVar5 != 3) goto LAB_001b25dd;
    bVar3 = cmsys::RegularExpression::find
                      (&local_260,(this_01->_M_dataplus)._M_p,&local_260.regmatch);
    if ((mode == INCLUDE) == bVar3) {
      this_01 = this_01 + 1;
      goto LAB_001b2546;
    }
  }
LAB_001b2595:
  pbVar6 = this_01 + 1;
  __first._M_current = this_01;
  if (pbVar6 != pbVar1 && this_01 != pbVar1) {
    do {
      bVar3 = cmsys::RegularExpression::find
                        (&local_260,(pbVar6->_M_dataplus)._M_p,&local_260.regmatch);
      if ((mode == INCLUDE) == bVar3) {
        std::__cxx11::string::operator=((string *)this_01,(string *)pbVar6);
        this_01 = this_01 + 1;
      }
      pbVar6 = pbVar6 + 1;
      __first._M_current = this_01;
    } while (pbVar6 != pbVar1);
  }
LAB_001b25dd:
  pcVar2 = local_278;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&local_278->Values,__first,
             (local_278->Values).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if (local_260.program != (char *)0x0) {
    operator_delete__(local_260.program);
  }
  return pcVar2;
}

Assistant:

cmList& cmList::filter(cm::string_view pattern, FilterMode mode)
{
  cmsys::RegularExpression regex(std::string{ pattern });
  if (!regex.is_valid()) {
    throw std::invalid_argument(
      cmStrCat("sub-command FILTER, mode REGEX failed to compile regex \"",
               pattern, "\"."));
  }

  auto it = std::remove_if(this->Values.begin(), this->Values.end(),
                           MatchesRegex{ regex, mode });
  this->Values.erase(it, this->Values.end());

  return *this;
}